

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

size_t units::findWordOperatorSep(string *ustring,string *keyword)

{
  bool bVar1;
  size_t sVar2;
  char closeSegment;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  size_type sVar7;
  int index;
  int local_3c;
  size_t local_38;
  
  uVar3 = std::__cxx11::string::rfind
                    ((char *)ustring,(ulong)(keyword->_M_dataplus)._M_p,0xffffffffffffffff);
  uVar5 = uVar3;
  if (keyword->_M_string_length + uVar3 + 1 < ustring->_M_string_length) {
    pbVar6 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + uVar3);
    while ((((uVar5 = uVar3, *pbVar6 - 0x2a < 0x35 &&
             ((0x10000000000021U >> ((ulong)(*pbVar6 - 0x2a) & 0x3f) & 1) != 0)) &&
            (uVar5 = 0xffffffffffffffff, uVar3 != 0)) &&
           (uVar3 = std::__cxx11::string::rfind
                              ((char *)ustring,(ulong)(keyword->_M_dataplus)._M_p,uVar3 - 1),
           uVar3 != 0xffffffffffffffff))) {
      pbVar6 = (byte *)((ustring->_M_dataplus)._M_p + keyword->_M_string_length + uVar3);
    }
  }
  sVar7 = ustring->_M_string_length;
  do {
    if (uVar5 == 0xffffffffffffffff) {
      return 0xffffffffffffffff;
    }
    uVar4 = std::__cxx11::string::find_last_of((char *)ustring,0x19f43d,sVar7);
    bVar1 = false;
    uVar3 = sVar7;
    sVar2 = uVar5;
    if ((uVar4 != 0xffffffffffffffff) && (uVar5 <= uVar4)) {
      closeSegment = getMatchCharacter((ustring->_M_dataplus)._M_p[uVar4]);
      local_3c = (int)uVar4 + -2;
      segmentcheckReverse(ustring,closeSegment,&local_3c);
      uVar3 = (ulong)local_3c;
      bVar1 = (long)uVar3 >= 0;
      if ((long)uVar3 < 0) {
        local_38 = 0xffffffffffffffff;
        uVar3 = sVar7;
        sVar2 = local_38;
      }
      else {
        sVar2 = local_38;
        if (uVar3 < uVar5) {
          uVar5 = std::__cxx11::string::rfind
                            ((char *)ustring,(ulong)(keyword->_M_dataplus)._M_p,uVar3);
          sVar2 = local_38;
        }
      }
    }
    local_38 = sVar2;
    sVar7 = uVar3;
  } while (bVar1);
  return local_38;
}

Assistant:

static size_t
    findWordOperatorSep(const std::string& ustring, const std::string& keyword)
{
    auto sep = ustring.rfind(keyword);
    if (ustring.size() > sep + keyword.size() + 1) {
        auto keychar = ustring[sep + keyword.size()];
        while (keychar == '^' || keychar == '*' || keychar == '/') {
            if (sep == 0) {
                sep = std::string::npos;
                break;
            }
            sep = ustring.rfind(keyword, sep - 1);
            if (sep == std::string::npos) {
                break;
            }
            keychar = ustring[sep + keyword.size()];
        }
    }
    size_t findex = ustring.size();
    while (sep != std::string::npos) {
        auto lbrack = ustring.find_last_of(")}]", findex);

        if (lbrack == std::string::npos) {
            return sep;
        }
        if (lbrack < sep) {
            // this should not happen as it would mean the operator separator
            // didn't function properly
            return sep;  // LCOV_EXCL_LINE
        }
        auto cchar = getMatchCharacter(ustring[lbrack]);
        --lbrack;
        int index = static_cast<int>(lbrack) - 1;
        segmentcheckReverse(ustring, cchar, index);
        if (index < 0) {
            // this should not happen as it would mean we got this point by
            // bypassing some other checks
            return std::string::npos;  // LCOV_EXCL_LINE
        }
        findex = static_cast<size_t>(index);
        if (findex < sep) {
            sep = ustring.rfind(keyword, findex);
        }
    }
    return sep;
}